

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

decNumber * __thiscall
icu_63::MaybeStackHeaderAndArray<decNumber,_char,_34>::resize
          (MaybeStackHeaderAndArray<decNumber,_char,_34> *this,int32_t newCapacity,int32_t length)

{
  decNumber *p;
  int32_t length_local;
  int32_t newCapacity_local;
  MaybeStackHeaderAndArray<decNumber,_char,_34> *this_local;
  
  if (newCapacity < 0) {
    this_local = (MaybeStackHeaderAndArray<decNumber,_char,_34> *)0x0;
  }
  else {
    this_local = (MaybeStackHeaderAndArray<decNumber,_char,_34> *)
                 uprv_malloc_63((long)newCapacity + 0xc);
    if (this_local != (MaybeStackHeaderAndArray<decNumber,_char,_34> *)0x0) {
      if (length < 0) {
        p._0_4_ = 0;
      }
      else {
        p._0_4_ = length;
        if (0 < length) {
          if (this->capacity < length) {
            p._0_4_ = this->capacity;
          }
          if (newCapacity < (int32_t)p) {
            p._0_4_ = newCapacity;
          }
        }
      }
      memcpy(this_local,this->ptr,(long)(int32_t)p + 0xc);
      releaseMemory(this);
      this->ptr = (decNumber *)this_local;
      this->capacity = newCapacity;
      this->needToRelease = '\x01';
    }
  }
  return (decNumber *)this_local;
}

Assistant:

inline H *MaybeStackHeaderAndArray<H, T, stackCapacity>::resize(int32_t newCapacity,
                                                                int32_t length) {
    if(newCapacity>=0) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
      ::fprintf(::stderr,"MaybeStackHeaderAndArray alloc %d + %d * %ul\n", sizeof(H),newCapacity,sizeof(T));
#endif
        H *p=(H *)uprv_malloc(sizeof(H)+newCapacity*sizeof(T));
        if(p!=NULL) {
            if(length<0) {
                length=0;
            } else if(length>0) {
                if(length>capacity) {
                    length=capacity;
                }
                if(length>newCapacity) {
                    length=newCapacity;
                }
            }
            uprv_memcpy(p, ptr, sizeof(H)+(size_t)length*sizeof(T));
            releaseMemory();
            ptr=p;
            capacity=newCapacity;
            needToRelease=TRUE;
        }
        return p;
    } else {
        return NULL;
    }
}